

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigFeed.c
# Opt level: O0

int Fraig_GetHittingPattern(uint *pSims,int nWords)

{
  int local_24;
  int local_20;
  int b;
  int i;
  int nWords_local;
  uint *pSims_local;
  
  local_20 = 0;
  do {
    if (nWords <= local_20) {
      return -1;
    }
    if (pSims[local_20] != 0) {
      for (local_24 = 0; local_24 < 0x20; local_24 = local_24 + 1) {
        if ((pSims[local_20] & 1 << ((byte)local_24 & 0x1f)) != 0) {
          return local_20 * 0x20 + local_24;
        }
      }
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

int Fraig_GetHittingPattern( unsigned * pSims, int nWords )
{
    int i, b;
    for ( i = 0; i < nWords; i++ )
    {
        if ( pSims[i] == 0 )
            continue;
        for ( b = 0; b < 32; b++ )
            if ( pSims[i] & (1 << b) )
                return i * 32 + b;
    }
    return -1;
}